

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ReshapeLayerParams::InternalSwap
          (ReshapeLayerParams *this,ReshapeLayerParams *other)

{
  int iVar1;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->targetshape_,&other->targetshape_);
  iVar1 = this->mode_;
  this->mode_ = other->mode_;
  other->mode_ = iVar1;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void ReshapeLayerParams::InternalSwap(ReshapeLayerParams* other) {
  targetshape_.InternalSwap(&other->targetshape_);
  std::swap(mode_, other->mode_);
  std::swap(_cached_size_, other->_cached_size_);
}